

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCore.c
# Opt level: O3

int ZPdr_ManSimpleMic(Pdr_Man_t *p,int k,Pdr_Set_t **ppCube)

{
  int iRemove;
  undefined4 uVar1;
  int iVar2;
  int *piVar3;
  Pdr_Set_t *pPVar4;
  int iVar5;
  Pdr_Set_t *pCube;
  long lVar6;
  
  if (p->pPars->fSkipGeneral == 0) {
    piVar3 = Pdr_ManSortByPriority(p,*ppCube);
    pCube = *ppCube;
    if (0 < pCube->nLits) {
      iVar5 = 0;
      do {
        iRemove = piVar3[iVar5];
        lVar6 = (long)iRemove;
        if (*(int *)(&pCube->field_0x14 + lVar6 * 4) == -1) {
          __assert_fail("(*ppCube)->Lits[i] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCore.c"
                        ,0x150,"int ZPdr_ManSimpleMic(Pdr_Man_t *, int, Pdr_Set_t **)");
        }
        iVar2 = Pdr_SetIsInit(pCube,iRemove);
        pCube = *ppCube;
        if (iVar2 == 0) {
          uVar1 = *(undefined4 *)(&pCube->field_0x14 + lVar6 * 4);
          *(undefined4 *)(&pCube->field_0x14 + lVar6 * 4) = 0xffffffff;
          iVar2 = Pdr_ManCheckCube(p,k,pCube,(Pdr_Set_t **)0x0,p->pPars->nConfLimit,0,1);
          if (iVar2 == -1) {
            return -1;
          }
          pCube = *ppCube;
          *(undefined4 *)(&pCube->field_0x14 + lVar6 * 4) = uVar1;
          if (iVar2 != 0) {
            pPVar4 = Pdr_SetCreateFrom(pCube,iRemove);
            *ppCube = pPVar4;
            Pdr_SetDeref(pCube);
            if ((*ppCube)->nLits < 1) {
              __assert_fail("(*ppCube)->nLits > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrCore.c"
                            ,0x160,"int ZPdr_ManSimpleMic(Pdr_Man_t *, int, Pdr_Set_t **)");
            }
            piVar3 = Pdr_ManSortByPriority(p,*ppCube);
            iVar5 = iVar5 + -1;
            pCube = *ppCube;
          }
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < pCube->nLits);
    }
  }
  return 0;
}

Assistant:

int ZPdr_ManSimpleMic( Pdr_Man_t * p, int k, Pdr_Set_t ** ppCube )
{
    int * pOrder;
    int i, j, Lit, RetValue;
    Pdr_Set_t * pCubeTmp;
    // perform generalization
    if ( p->pPars->fSkipGeneral )
      return 0;

    // sort literals by their occurences
    pOrder = Pdr_ManSortByPriority( p, *ppCube );
    // try removing literals
    for ( j = 0; j < (*ppCube)->nLits; j++ )
    {
        // use ordering
    //        i = j;
        i = pOrder[j];

        assert( (*ppCube)->Lits[i] != -1 );
        // check init state
        if ( Pdr_SetIsInit(*ppCube, i) )
            continue;
        // try removing this literal
        Lit = (*ppCube)->Lits[i]; (*ppCube)->Lits[i] = -1; 
        RetValue = Pdr_ManCheckCube( p, k, *ppCube, NULL, p->pPars->nConfLimit, 0, 1 );
        if ( RetValue == -1 )
            return -1;
        (*ppCube)->Lits[i] = Lit;
        if ( RetValue == 0 )
            continue;

        // success - update the cube
        *ppCube = Pdr_SetCreateFrom( pCubeTmp = *ppCube, i );
        Pdr_SetDeref( pCubeTmp );
        assert( (*ppCube)->nLits > 0 );

        // get the ordering by decreasing priority
        pOrder = Pdr_ManSortByPriority( p, *ppCube );
        j--;
    }
    return 0;
}